

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::ByteArray::Squeeze(ByteArray *this)

{
  vector<char,_std::allocator<char>_> t;
  vector<char,_std::allocator<char>_> *in_stack_00000028;
  vector<char,_std::allocator<char>_> *in_stack_00000030;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  std::vector<char,_std::allocator<char>_>::vector(in_stack_00000030,in_stack_00000028);
  std::vector<char,_std::allocator<char>_>::swap
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffff0);
  return;
}

Assistant:

void ByteArray::Squeeze()
{
    std::vector<char> t(m_data);
    t.swap(m_data);
}